

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9VmInstallForeignFunction
                (jx9_vm *pVm,SyString *pName,ProcHostFunction xFunc,void *pUserData)

{
  sxu32 nKeyLen;
  void *pvVar1;
  sxi32 sVar2;
  SyHashEntry_Pr *pSVar3;
  undefined8 *pUserData_00;
  char *pKey;
  
  if (((pName->nByte != 0) && ((pVm->hHostFunction).nEntry != 0)) &&
     (pSVar3 = HashGetEntry(&pVm->hHostFunction,pName->zString,pName->nByte),
     pSVar3 != (SyHashEntry_Pr *)0x0)) {
    pvVar1 = pSVar3->pUserData;
    *(void **)((long)pvVar1 + 0x20) = pUserData;
    *(ProcHostFunction *)((long)pvVar1 + 0x18) = xFunc;
    *(undefined4 *)((long)pvVar1 + 0x38) = 0;
    *(undefined4 *)((long)pvVar1 + 0x44) = 0;
    return 0;
  }
  pUserData_00 = (undefined8 *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x50);
  if (pUserData_00 != (undefined8 *)0x0) {
    pKey = SyMemBackendStrDup(&pVm->sAllocator,pName->zString,pName->nByte);
    if (pKey != (char *)0x0) {
      *pUserData_00 = 0;
      pUserData_00[1] = 0;
      pUserData_00[8] = 0;
      pUserData_00[9] = 0;
      pUserData_00[6] = 0;
      pUserData_00[7] = 0;
      pUserData_00[4] = 0;
      pUserData_00[5] = 0;
      pUserData_00[2] = 0;
      pUserData_00[3] = 0;
      pUserData_00[1] = pKey;
      nKeyLen = pName->nByte;
      *(sxu32 *)(pUserData_00 + 2) = nKeyLen;
      *pUserData_00 = pVm;
      pUserData_00[3] = xFunc;
      pUserData_00[4] = pUserData;
      *(undefined4 *)(pUserData_00 + 7) = 0;
      *(undefined4 *)(pUserData_00 + 8) = 8;
      pUserData_00[5] = pVm;
      pUserData_00[9] = 0;
      sVar2 = SyHashInsert(&pVm->hHostFunction,pKey,nKeyLen,pUserData_00);
      if (sVar2 == 0) {
        return 0;
      }
      SyMemBackendFree(&pVm->sAllocator,(void *)pUserData_00[1]);
    }
    SyMemBackendPoolFree(&pVm->sAllocator,pUserData_00);
  }
  return -1;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmInstallForeignFunction(
	jx9_vm *pVm,              /* Target VM */
	const SyString *pName,    /* Foreign function name */
	ProcHostFunction xFunc,  /* Foreign function implementation */
	void *pUserData           /* Foreign function private data */
	)
{
	jx9_user_func *pFunc;
	SyHashEntry *pEntry;
	sxi32 rc;
	/* Overwrite any previously registered function with the same name */
	pEntry = SyHashGet(&pVm->hHostFunction, pName->zString, pName->nByte);
	if( pEntry ){
		pFunc = (jx9_user_func *)pEntry->pUserData;
		pFunc->pUserData = pUserData;
		pFunc->xFunc = xFunc;
		SySetReset(&pFunc->aAux);
		return SXRET_OK;
	}
	/* Create a new user function */
	rc = jx9NewForeignFunction(&(*pVm), &(*pName), xFunc, pUserData, &pFunc);
	if( rc != SXRET_OK ){
		return rc;
	}
	/* Install the function in the corresponding hashtable */
	rc = SyHashInsert(&pVm->hHostFunction, SyStringData(&pFunc->sName), pName->nByte, pFunc);
	if( rc != SXRET_OK ){
		SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pFunc->sName));
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
		return rc;
	}
	/* User function successfully installed */
	return SXRET_OK;
}